

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.h
# Opt level: O1

void TTD::NSLogEvents::
     JsRTVarAndIntegralArgumentsAction_InternalUse_Parse<(TTD::NSLogEvents::EventKind)59,2ul,2ul>
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  int iVar1;
  TTDVar pvVar2;
  undefined4 extraout_var;
  size_t i;
  long lVar3;
  
  if (evt->EventKind == SetPropertyActionTag) {
    (*reader->_vptr_FileReader[3])(reader,0x12,1);
    lVar3 = 0;
    pvVar2 = NSSnapValues::ParseTTDVar(false,reader);
    *(TTDVar *)(evt + 1) = pvVar2;
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    do {
      pvVar2 = NSSnapValues::ParseTTDVar(lVar3 != 0,reader);
      (&evt[1].EventTimeStamp)[lVar3] = (int64)pvVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    lVar3 = 0;
    do {
      iVar1 = (*reader->_vptr_FileReader[0xd])(reader,1);
      (&evt[2].EventTimeStamp)[lVar3] = CONCAT44(extraout_var,iVar1);
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    (*reader->_vptr_FileReader[5])(reader);
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void JsRTVarAndIntegralArgumentsAction_InternalUse_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTVarAndIntegralArgumentsAction_InternalUse<vcount, icount>* vAction = GetInlineEventDataAs<JsRTVarAndIntegralArgumentsAction_InternalUse<vcount, icount>, tag>(evt);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            vAction->Result = NSSnapValues::ParseTTDVar(false, reader);

            reader->ReadSequenceStart_WDefaultKey(true);
            for(size_t i = 0; i < vcount; ++i)
            {
                vAction->VarArray[i] = NSSnapValues::ParseTTDVar(i != 0, reader);
            }

            for(size_t i = 0; i < icount; ++i)
            {
                vAction->ScalarArray[i] = reader->ReadNakedInt64(vcount + i != 0);
            }
            reader->ReadSequenceEnd();
        }